

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::FreeColSingletonPS(FreeColSingletonPS *this,FreeColSingletonPS *old)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int32_t iVar11;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006a4118;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar8 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar8;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeColSingletonPS_006a48e8;
  iVar8 = old->m_i;
  iVar9 = old->m_old_j;
  iVar10 = old->m_old_i;
  this->m_j = old->m_j;
  this->m_i = iVar8;
  this->m_old_j = iVar9;
  this->m_old_i = iVar10;
  uVar1 = *(undefined8 *)(old->m_obj).m_backend.data._M_elems;
  uVar2 = *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 2);
  uVar3 = *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 4);
  uVar4 = *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 6);
  uVar5 = *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 8);
  uVar6 = *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 10);
  uVar7 = *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 0xe);
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 0xc) =
       *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 0xc);
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 0xe) = uVar7;
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8) = uVar5;
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 10) = uVar6;
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4) = uVar3;
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6) = uVar4;
  *(undefined8 *)(this->m_obj).m_backend.data._M_elems = uVar1;
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2) = uVar2;
  (this->m_obj).m_backend.exp = (old->m_obj).m_backend.exp;
  (this->m_obj).m_backend.neg = (old->m_obj).m_backend.neg;
  iVar11 = (old->m_obj).m_backend.prec_elem;
  (this->m_obj).m_backend.fpclass = (old->m_obj).m_backend.fpclass;
  (this->m_obj).m_backend.prec_elem = iVar11;
  uVar1 = *(undefined8 *)((old->m_lRhs).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_lRhs).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_lRhs).m_backend.data._M_elems + 6);
  uVar4 = *(undefined8 *)((old->m_lRhs).m_backend.data._M_elems + 8);
  uVar5 = *(undefined8 *)((old->m_lRhs).m_backend.data._M_elems + 10);
  uVar6 = *(undefined8 *)((old->m_lRhs).m_backend.data._M_elems + 0xc);
  uVar7 = *(undefined8 *)((old->m_lRhs).m_backend.data._M_elems + 0xe);
  *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems =
       *(undefined8 *)(old->m_lRhs).m_backend.data._M_elems;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8) = uVar4;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 10) = uVar5;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 0xc) = uVar6;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 0xe) = uVar7;
  (this->m_lRhs).m_backend.exp = (old->m_lRhs).m_backend.exp;
  (this->m_lRhs).m_backend.neg = (old->m_lRhs).m_backend.neg;
  iVar11 = (old->m_lRhs).m_backend.prec_elem;
  (this->m_lRhs).m_backend.fpclass = (old->m_lRhs).m_backend.fpclass;
  (this->m_lRhs).m_backend.prec_elem = iVar11;
  this->m_onLhs = old->m_onLhs;
  this->m_eqCons = old->m_eqCons;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_row)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a3d50;
  (this->m_row).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_row,
             (old->m_row).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  return;
}

Assistant:

FreeColSingletonPS(const FreeColSingletonPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_i(old.m_i)
         , m_old_j(old.m_old_j)
         , m_old_i(old.m_old_i)
         , m_obj(old.m_obj)
         , m_lRhs(old.m_lRhs)
         , m_onLhs(old.m_onLhs)
         , m_eqCons(old.m_eqCons)
         , m_row(old.m_row)
      {}